

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

bool __thiscall
QItemSelectionModel::rowIntersectsSelection(QItemSelectionModel *this,int row,QModelIndex *parent)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_00;
  long lVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  parameter_type pQVar9;
  QItemSelectionRange *pQVar10;
  QItemSelectionRange *this_01;
  long in_FS_OFFSET;
  bool bVar11;
  QModelIndex local_70;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  this_00 = (QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             *)(lVar1 + 0x78);
  pQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
           ::value(this_00);
  if ((pQVar9 == (parameter_type)0x0) ||
     ((((-1 < parent->r && (-1 < parent->c)) && ((parent->m).ptr != (QAbstractItemModel *)0x0)) &&
      (pQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                ::value(this_00), pQVar9 != (parent->m).ptr)))) {
    bVar11 = false;
  }
  else {
    local_58.d = *(Data **)(lVar1 + 0x80);
    local_58.ptr = *(QItemSelectionRange **)(lVar1 + 0x88);
    local_58.size = *(long *)(lVar1 + 0x90);
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QItemSelection::merge
              ((QItemSelection *)&local_58,(QItemSelection *)(lVar1 + 0x98),
               (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
               ((QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> *)(lVar1 + 0xb8))->
               super_QFlagsStorage<QItemSelectionModel::SelectionFlag>);
    if (((local_58.size == 0) ||
        (QPersistentModelIndex::parent(&local_70,&(local_58.ptr)->tl), local_70.r != parent->r)) ||
       ((local_70.c != parent->c ||
        ((local_70.i != parent->i || (local_70.m.ptr != (parent->m).ptr)))))) {
      bVar11 = false;
    }
    else {
      bVar11 = local_58.size != 0;
      if (bVar11) {
        pQVar10 = local_58.ptr + local_58.size;
        this_01 = local_58.ptr;
        do {
          iVar5 = QPersistentModelIndex::row(&this_01->tl);
          iVar6 = QPersistentModelIndex::row(&this_01->br);
          if ((row < iVar5) || (iVar6 < row)) {
LAB_0046f01e:
            bVar4 = false;
          }
          else {
            uVar7 = QPersistentModelIndex::column(&this_01->tl);
            iVar5 = QPersistentModelIndex::column(&this_01->br);
            bVar3 = iVar5 < (int)uVar7;
            if ((int)uVar7 <= iVar5) {
              do {
                QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                ::value(this_00);
                pQVar2 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
                (*(pQVar2->super_QObject)._vptr_QObject[0xc])
                          (&local_70,pQVar2,(ulong)(uint)row,(ulong)uVar7,parent);
                if (local_70.m.ptr == (QAbstractItemModel *)0x0) {
                  uVar8 = 0;
                }
                else {
                  uVar8 = (*((local_70.m.ptr)->super_QObject)._vptr_QObject[0x27])
                                    (local_70.m.ptr,&local_70);
                }
                if ((~uVar8 & 0x21) == 0) {
                  bVar4 = true;
                  goto LAB_0046f014;
                }
                uVar8 = uVar7 + 1;
                bVar3 = iVar5 <= (int)uVar7;
                uVar7 = uVar8;
              } while (iVar5 + 1U != uVar8);
            }
            bVar4 = false;
LAB_0046f014:
            if (bVar3) goto LAB_0046f01e;
          }
          if (bVar4) break;
          this_01 = this_01 + 1;
          bVar11 = this_01 != pQVar10;
        } while (bVar11);
      }
    }
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar11;
}

Assistant:

bool QItemSelectionModel::rowIntersectsSelection(int row, const QModelIndex &parent) const
{
    Q_D(const QItemSelectionModel);
    if (!d->model.value())
        return false;
    if (parent.isValid() && d->model != parent.model())
         return false;

    QItemSelection sel = d->ranges;
    sel.merge(d->currentSelection, d->currentCommand);
    if (sel.isEmpty() || sel.constFirst().parent() != parent)
        return false;

    for (const QItemSelectionRange &range : std::as_const(sel)) {
        int top = range.top();
        int bottom = range.bottom();
        if (top <= row && bottom >= row) {
            int left = range.left();
            int right = range.right();
            for (int j = left; j <= right; j++) {
                if (isSelectableAndEnabled(d->model->index(row, j, parent).flags()))
                    return true;
            }
        }
    }

    return false;
}